

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O0

void __thiscall
Memory::AutoRestoreValue<bool>::AutoRestoreValue(AutoRestoreValue<bool> *this,bool *var,bool *val)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool *val_local;
  bool *var_local;
  AutoRestoreValue<bool> *this_local;
  
  this->variable = var;
  if (var == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                       ,0x56,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->oldValue = (bool)(*this->variable & 1);
  *this->variable = (bool)(*val & 1);
  this->debugSetValue = (bool)(*val & 1);
  return;
}

Assistant:

AutoRestoreValue(T* var, const T& val):
        variable(var)
    {
        Assert(var);
        oldValue = (*variable);
        (*variable) = val;
#ifdef DEBUG
        debugSetValue = val;
#endif
    }